

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_parsePrimitiveDataTypeTest_Test::
~OpenDDLParserTest_parsePrimitiveDataTypeTest_Test
          (OpenDDLParserTest_parsePrimitiveDataTypeTest_Test *this)

{
  OpenDDLParserTest::~OpenDDLParserTest(&this->super_OpenDDLParserTest);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parsePrimitiveDataTypeTest) {
    Value::ValueType type;
    size_t len(0);
    char *in = OpenDDLParser::parsePrimitiveDataType(nullptr, nullptr, type, len);
    ASSERT_EQ(nullptr, in);
    EXPECT_EQ(Value::ValueType::ddl_none, type);
    EXPECT_EQ(0U, len);

    size_t len1(0);
    char token1[] = "float", *end1(findEnd(token1, len1));
    in = OpenDDLParser::parsePrimitiveDataType(token1, end1, type, len);
    EXPECT_EQ(Value::ValueType::ddl_float, type);
    EXPECT_EQ(1U, len);

    size_t len2(0);
    char invalidToken[] = "foat", *end2(findEnd(token1, len2));
    in = OpenDDLParser::parsePrimitiveDataType(invalidToken, end2, type, len);
    EXPECT_EQ(Value::ValueType::ddl_none, type);
    EXPECT_EQ(0U, len);
}